

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int parse_attr_token(char *str,char *attr_name,char **val,size_t *vallen)

{
  char cVar1;
  int iVar2;
  size_t len;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  *val = (char *)0x0;
  *vallen = 0;
  len = strlen(attr_name);
  do {
    do {
      pcVar3 = strchr(str,0x3b);
      pcVar6 = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_0020667c;
      do {
        str = pcVar6 + 1;
        iVar2 = isspace((int)pcVar6[1]);
        pcVar6 = str;
      } while (iVar2 != 0);
      iVar2 = memicmp(str,attr_name,len);
    } while (iVar2 != 0);
    pcVar6 = str + len;
    do {
      str = pcVar6;
      cVar1 = *str;
      iVar2 = isspace((int)cVar1);
      pcVar6 = str + 1;
    } while (iVar2 != 0);
  } while (cVar1 != '=');
  do {
    pcVar7 = pcVar6;
    cVar1 = *pcVar7;
    iVar2 = isspace((int)cVar1);
    pcVar6 = pcVar7 + 1;
  } while (iVar2 != 0);
  if (cVar1 == '\"') {
    *val = pcVar6;
    for (pcVar5 = pcVar6; (pcVar7 = pcVar6, *pcVar5 != '\0' && (*pcVar5 != '\"'));
        pcVar5 = pcVar5 + 1) {
    }
  }
  else {
    *val = pcVar7;
    pcVar5 = pcVar7;
    while ((*pcVar5 != '\0' && (pvVar4 = memchr(" \t;,",(int)*pcVar5,5), pvVar4 == (void *)0x0))) {
      pcVar5 = pcVar5 + 1;
    }
  }
  *vallen = (long)pcVar5 - (long)pcVar7;
LAB_0020667c:
  return (int)(pcVar3 != (char *)0x0);
}

Assistant:

static int parse_attr_token(const char *str, const char *attr_name,
                            const char *&val, size_t &vallen)
{
    /* assume we won't find anything */
    val = 0;
    vallen = 0;

    /* note the name length */
    size_t attr_name_len = strlen(attr_name);

    /* scan the string for attribute tokens, starting at the first ';' */
    for (const char *p = strchr(str, ';') ; p != 0 ; p = strchr(p, ';'))
    {
        /* skip spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* check to see if this is the desired attribute name */
        if (memicmp(p, attr_name, attr_name_len) != 0)
            continue;

        /* skip the name and any subsequent spaces, and look for the '=' */
        for (p += attr_name_len ; isspace(*p) ; ++p) ;
        if (*p != '=')
            continue;

        /* skip the '=' and subsequent spaces */
        for (++p ; isspace(*p) ; ++p) ;

        /* 
         *   Okay, we're at the attribute value.  If there's a quote mark,
         *   the value is everything from here to the close quote.  Otherwise
         *   it's everything up to the next space or semicolon.  
         */
        if (*p == '"')
        {
            /* skip the open quote, and find the close quote */
            for (val = ++p ; *p != '\0' && *p != '"' ; ++p) ;
        }
        else
        {
            /* it's from here to the next separator character */
            val = p;
            for ( ; *p != '\0' && strchr(" \t;,", *p) == 0 ; ++p) ;
        }

        /* note the length, and return success */
        vallen = p - val;
        return TRUE;
    }

    /* didn't find it - return failure */
    return FALSE;
}